

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.hpp
# Opt level: O0

void __thiscall ear::ObjectsTypeMetadata::~ObjectsTypeMetadata(ObjectsTypeMetadata *this)

{
  ObjectsTypeMetadata *this_local;
  
  boost::variant<ear::PolarScreen,_ear::CartesianScreen>::~variant(&this->referenceScreen);
  ZoneExclusion::~ZoneExclusion(&this->zoneExclusion);
  boost::variant<ear::PolarObjectDivergence,_ear::CartesianObjectDivergence>::~variant
            (&this->objectDivergence);
  boost::variant<ear::CartesianPosition,_ear::PolarPosition>::~variant(&this->position);
  return;
}

Assistant:

struct EAR_EXPORT ObjectsTypeMetadata {
    Position position = {};
    double width = 0.0;
    double height = 0.0;
    double depth = 0.0;
    /// value of the `cartesian` flag; should be the same type as used in
    /// position, objectDivergence and zoneExclusion, otherwise expect
    /// warnings.
    bool cartesian = false;
    double gain = 1.0;
    double diffuse = 0.0;
    ChannelLock channelLock = {};
    ObjectDivergence objectDivergence = {};
    ZoneExclusion zoneExclusion = {};
    bool screenRef = false;
    /// screen specification from the `audioProgrammeReferenceScreen` element
    /// of the `audioProgramme` being rendered
    Screen referenceScreen = getDefaultScreen();
  }